

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

void indent_buffer(Buffer *buffer,int n,int newline)

{
  int iVar1;
  int local_14;
  int newline_local;
  int n_local;
  Buffer *buffer_local;
  
  local_14 = n;
  if (newline == 0) {
    buffer_append(buffer,indent_buffer::spaces,1);
  }
  else {
    do {
      if (local_14 == 0) {
        return;
      }
      iVar1 = buffer_append(buffer,indent_buffer::spaces,4);
      local_14 = local_14 + -1;
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

static void indent_buffer(Buffer *buffer, int n, const int newline)
{
#if MATCH_MICROSOFT_PREPROCESSOR
    static char spaces[4] = { ' ', ' ', ' ', ' ' };
    if (newline)
    {
        while (n--)
        {
            if (!buffer_append(buffer, spaces, sizeof (spaces)))
                return;
        } // while
    } // if
    else
    {
        if (!buffer_append(buffer, spaces, 1))
            return;
    } // else
#endif
}